

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::TypeValidator<double>::TypeValidator(TypeValidator<double> *this,string *validator_name)

{
  anon_class_1_0_00000001 local_59;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  string local_38;
  string *local_18;
  string *validator_name_local;
  TypeValidator<double> *this_local;
  
  local_18 = validator_name;
  validator_name_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)validator_name);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::TypeValidator<double>::TypeValidator(std::__cxx11::string_const&)::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&local_58,&local_59);
  Validator::Validator(&this->super_Validator,&local_38,&local_58);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit TypeValidator(const std::string &validator_name)
        : Validator(validator_name, [](std::string &input_string) {
              using CLI::detail::lexical_cast;
              auto val = DesiredType();
              if(!lexical_cast(input_string, val)) {
                  return std::string("Failed parsing ") + input_string + " as a " + detail::type_name<DesiredType>();
              }
              return std::string();
          }) {}